

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void isNonNegative(char *attrName,float f)

{
  ostream *poVar1;
  invalid_argument *this;
  string local_1c0 [32];
  stringstream e;
  ostream local_190 [376];
  
  if (0.0 <= f) {
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&e);
  poVar1 = std::operator<<(local_190,"The value for the ");
  poVar1 = std::operator<<(poVar1,attrName);
  std::operator<<(poVar1," attribute must not be less than zero");
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this,local_1c0);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
isNonNegative (const char attrName[], float f)
{
    if (f < 0)
    {
        std::stringstream e;
        e << "The value for the " << attrName
          << " attribute must not be less than zero";
        throw invalid_argument(e.str());
    }
}